

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O3

void __thiscall JtagAnalyzer::JtagAnalyzer(JtagAnalyzer *this)

{
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__JtagAnalyzer_00110c90;
  JtagAnalyzerSettings::JtagAnalyzerSettings(&this->mSettings);
  (this->mResults)._M_ptr = (JtagAnalyzerResults *)0x0;
  JtagSimulationDataGenerator::JtagSimulationDataGenerator(&this->mSimulationDataGenerator);
  JtagTAP_Controller::JtagTAP_Controller(&this->mTAPCtrl);
  this->mSimulationInitilized = false;
  Analyzer::UseFrameV2();
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

JtagAnalyzer::JtagAnalyzer() : mSimulationInitilized( false )
{
    UseFrameV2();
    SetAnalyzerSettings( &mSettings );
}